

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  anon_struct_72_3_9ed89b7b *paVar1;
  Mat *this_00;
  long lVar2;
  bool bVar3;
  Mat MStack_68;
  
  paVar1 = this->params;
  lVar2 = 0x14;
  while (this_00 = &paVar1->v, bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    *(undefined4 *)((long)(this_00 + -1) + 0x38) = 0;
    MStack_68.elemsize._0_4_ = 0;
    MStack_68._20_8_ = 0;
    MStack_68.data = (void *)0x0;
    MStack_68.refcount._0_4_ = 0;
    MStack_68.refcount._4_4_ = 0;
    MStack_68.h = 0;
    MStack_68.c = 0;
    MStack_68.cstep = 0;
    MStack_68.allocator = (Allocator *)0x0;
    MStack_68.dims = 0;
    MStack_68.w = 0;
    Mat::operator=(this_00,&MStack_68);
    Mat::~Mat(&MStack_68);
    paVar1 = (anon_struct_72_3_9ed89b7b *)(this_00 + 1);
  }
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].loaded = 0;
        params[i].v = Mat();
    }
}